

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O3

string * __thiscall
testing::internal::ConvertIdentifierNameToWords_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *id_name)

{
  internal iVar1;
  int iVar2;
  uint uVar3;
  uint __c;
  bool bVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = *this;
  if (iVar1 != (internal)0x0) {
    uVar3 = 0;
    do {
      __c = (uint)(byte)iVar1;
      iVar2 = isupper(__c);
      if ((iVar2 == 0) &&
         ((iVar2 = isalpha(uVar3), iVar2 != 0 || (iVar2 = islower(__c), iVar2 == 0)))) {
        if (9 < uVar3 - 0x30) {
          bVar4 = __c - 0x3a < 0xfffffff6;
          goto LAB_00267fff;
        }
        iVar2 = isalnum(__c);
        uVar3 = __c;
        if (iVar2 != 0) goto LAB_0026804e;
      }
      else {
        bVar4 = false;
LAB_00267fff:
        iVar2 = isalnum(__c);
        uVar3 = __c;
        if (iVar2 != 0) {
          if (!bVar4 && __return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            __c = (uint)(byte)*this;
          }
LAB_0026804e:
          tolower(__c);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          uVar3 = (uint)(byte)*this;
        }
      }
      iVar1 = this[1];
      this = this + 1;
    } while (iVar1 != (internal)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string ConvertIdentifierNameToWords(const char* id_name) {
  std::string result;
  char prev_char = '\0';
  for (const char* p = id_name; *p != '\0'; prev_char = *(p++)) {
    // We don't care about the current locale as the input is
    // guaranteed to be a valid C++ identifier name.
    const bool starts_new_word = IsUpper(*p) ||
                                 (!IsAlpha(prev_char) && IsLower(*p)) ||
                                 (!IsDigit(prev_char) && IsDigit(*p));

    if (IsAlNum(*p)) {
      if (starts_new_word && !result.empty()) result += ' ';
      result += ToLower(*p);
    }
  }
  return result;
}